

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_2::FileState::Unref(FileState *this)

{
  MutexLock local_20;
  MutexLock lock;
  bool do_delete;
  FileState *this_local;
  
  lock.mu_._7_1_ = 0;
  MutexLock::MutexLock(&local_20,&this->refs_mutex_);
  this->refs_ = this->refs_ + -1;
  if (this->refs_ < 0) {
    __assert_fail("refs_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv.cc"
                  ,0x2e,"void leveldb::(anonymous namespace)::FileState::Unref()");
  }
  if (this->refs_ < 1) {
    lock.mu_._7_1_ = 1;
  }
  MutexLock::~MutexLock(&local_20);
  if (((lock.mu_._7_1_ & 1) != 0) && (this != (FileState *)0x0)) {
    ~FileState(this);
    operator_delete(this);
  }
  return;
}

Assistant:

void Unref() {
    bool do_delete = false;

    {
      MutexLock lock(&refs_mutex_);
      --refs_;
      assert(refs_ >= 0);
      if (refs_ <= 0) {
        do_delete = true;
      }
    }

    if (do_delete) {
      delete this;
    }
  }